

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namespace.cpp
# Opt level: O2

void __thiscall
LiteScript::_Type_NAMESPACE::Save
          (_Type_NAMESPACE *this,ostream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Namespace *this_00;
  uint uVar1;
  char *pcVar2;
  ostream *poVar3;
  Object *pOVar4;
  uint idx;
  long *plVar5;
  long in_R8;
  code *pcVar6;
  Variable local_40;
  
  this_00 = (Namespace *)object->data;
  uVar1 = Namespace::Count(this_00);
  OStreamer::Write<unsigned_int>(stream,uVar1);
  uVar1 = Namespace::Count(this_00);
  for (idx = 0; uVar1 != idx; idx = idx + 1) {
    pcVar2 = Namespace::GetKey(this_00,idx);
    poVar3 = std::operator<<(stream,pcVar2);
    std::operator<<(poVar3,'\0');
    plVar5 = (long *)((long)(object->memory->arr)._M_elems + in_R8);
    pcVar6 = (code *)caller;
    if ((caller & 1) != 0) {
      pcVar6 = *(code **)(*plVar5 + -1 + caller);
    }
    Namespace::GetVariable((Namespace *)&local_40,(uint)this_00);
    pOVar4 = Variable::operator->(&local_40);
    (*pcVar6)(plVar5,stream,pOVar4->ID);
    Variable::~Variable(&local_40);
  }
  return;
}

Assistant:

void LiteScript::_Type_NAMESPACE::Save(std::ostream &stream, Object &object, bool (Memory::*caller)(std::ostream&, unsigned int)) const {
    Namespace& obj = object.GetData<Namespace>();
    OStreamer::Write<unsigned int>(stream, obj.Count());
    for (unsigned int i = 0, sz = obj.Count(); i < sz; i++) {
        stream << obj.GetKey(i) << (uint8_t)0;
        (object.memory.*caller)(stream, obj.GetVariable(i)->ID);
    }
}